

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::AssertHelper::operator=(AssertHelper *this,Message *message)

{
  Type result_type;
  int line_number;
  Type TVar1;
  AssertHelperData *pAVar2;
  char *file_name;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  UnitTest::GetInstance();
  pAVar2 = this->data_;
  result_type = pAVar2->type;
  file_name = pAVar2->file;
  line_number = pAVar2->line;
  AppendUserMessage(&local_48,&pAVar2->message,message);
  TVar1 = this->data_->type;
  if ((TVar1 == kSuccess) || (TVar1 == kSkip)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,anon_var_dwarf_651463 + 5,&local_69);
  }
  else {
    UnitTest::GetInstance();
    UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_
              (&local_68,UnitTest::GetInstance::instance.impl_,1);
  }
  UnitTest::AddTestPartResult
            (&UnitTest::GetInstance::instance,result_type,file_name,line_number,&local_48,&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void AssertHelper::operator=(const Message& message) const {
  UnitTest::GetInstance()->AddTestPartResult(
      data_->type, data_->file, data_->line,
      AppendUserMessage(data_->message, message),
      ShouldEmitStackTraceForResultType(data_->type)
          ? UnitTest::GetInstance()->impl()->CurrentOsStackTraceExceptTop(1)
          : ""
      // Skips the stack frame for this function itself.
  );  // NOLINT
}